

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::GetLabel(TypeChecker *this,Index depth,Label **out_label)

{
  pointer pLVar1;
  pointer pLVar2;
  Enum EVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  Label *pLVar7;
  
  uVar5 = (ulong)depth;
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->label_stack_).
           super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pLVar2 - (long)pLVar1;
  uVar4 = (lVar6 >> 3) * -0x71c71c71c71c71c7;
  if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
    if (pLVar2 == pLVar1) {
      __assert_fail("label_stack_.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/type-checker.cc"
                    ,0x3f,"Result wabt::TypeChecker::GetLabel(Index, Label **)");
    }
    pLVar7 = (Label *)0x0;
    PrintError(this,"invalid depth: %u (max %zd)",depth,uVar4 - 1);
    EVar3 = Error;
  }
  else {
    pLVar7 = (Label *)((long)pLVar1 + ~uVar5 * 0x48 + lVar6);
    EVar3 = Ok;
  }
  *out_label = pLVar7;
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::GetLabel(Index depth, Label** out_label) {
  if (depth >= label_stack_.size()) {
    assert(label_stack_.size() > 0);
    PrintError("invalid depth: %" PRIindex " (max %" PRIzd ")", depth,
               label_stack_.size() - 1);
    *out_label = nullptr;
    return Result::Error;
  }
  *out_label = &label_stack_[label_stack_.size() - depth - 1];
  return Result::Ok;
}